

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDress2.c
# Opt level: O2

void Abc_NtkDressMapSetPolarity(Abc_Ntk_t *pNtk)

{
  uint uVar1;
  Abc_Obj_t *pAVar2;
  ulong uVar3;
  int i;
  
  for (i = 0; i < pNtk->vObjs->nSize; i = i + 1) {
    pAVar2 = Abc_NtkObj(pNtk,i);
    if (pAVar2 != (Abc_Obj_t *)0x0) {
      uVar3 = (ulong)(pAVar2->field_6).pTemp & 0xfffffffffffffffe;
      if ((uVar3 != 0) && (uVar1 = *(uint *)(uVar3 + 0x14), (uVar1 & 0xf) != 0)) {
        *(uint *)&pAVar2->field_0x14 =
             *(uint *)&pAVar2->field_0x14 & 0xffffff7f |
             (uVar1 ^ (pAVar2->field_6).iTemp << 7) & 0x80;
      }
    }
  }
  return;
}

Assistant:

void Abc_NtkDressMapSetPolarity( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pObj, * pAnd;
    int i;
    // each node refers to the the strash copy whose polarity is set
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
        if ( (pAnd = Abc_ObjRegular(pObj->pCopy)) && Abc_ObjType(pAnd) != ABC_OBJ_NONE ) // strashed object is present and legal
            pObj->fPhase = pAnd->fPhase ^ Abc_ObjIsComplement(pObj->pCopy);
    }
}